

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_CR_OR_LF(FlowBuffer *this)

{
  const_byteptr puVar1;
  long lVar2;
  long lVar3;
  const_byteptr data;
  
  data = this->orig_data_begin_;
  if ((data == (const_byteptr)0x0) || (puVar1 = this->orig_data_end_, puVar1 == (const_byteptr)0x0))
  {
    return;
  }
  if ((data < puVar1) && ((this->state_ == CR_OR_LF_1 && (*data == '\n')))) {
    this->state_ = CR_OR_LF_0;
    data = data + 1;
    this->orig_data_begin_ = data;
  }
  lVar3 = (long)puVar1 - (long)data;
  if (data <= puVar1 && lVar3 != 0) {
    lVar2 = 0;
    do {
      if (data[lVar2] == '\n') {
LAB_0010290b:
        if (this->buffer_n_ == 0) {
          this->frame_length_ = (int)lVar2;
        }
        else {
          AppendToBuffer(this,data,(int)lVar2 + 1);
          this->buffer_n_ = this->buffer_n_ + -1;
        }
        this->message_complete_ = true;
        return;
      }
      if (data[lVar2] == '\r') {
        this->state_ = CR_OR_LF_1;
        goto LAB_0010290b;
      }
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  AppendToBuffer(this,data,(int)lVar3);
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_CR_OR_LF()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	if ( state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ && *orig_data_begin_ == LF )
		{
		state_ = CR_OR_LF_0;
		++orig_data_begin_;
		}

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		switch ( *data )
			{
			case CR:
				state_ = CR_OR_LF_1;
				goto found_end_of_line;

			case LF:
				// state_ = CR_OR_LF_0;
				goto found_end_of_line;

			default:
				// state_ = CR_OR_LF_0;
				break;
			}
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last CR or LF
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}